

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::init
          (TransformFeedbackCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  VarTypeComponent *pVVar3;
  anon_struct_8_2_bfd9d0cb_for_basic varyingName;
  deUint32 dVar4;
  GLuint GVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pVVar7;
  TransformFeedback *this_00;
  value_type *pvVar8;
  pointer pcVar9;
  pointer pOVar10;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Varying_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>_>
  __last;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var11;
  iterator iVar12;
  iterator iVar13;
  GLuint *pGVar14;
  void *pvVar15;
  Functions *pFVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  bool bVar18;
  int iVar19;
  GLenum GVar20;
  DataType dataType;
  int extraout_EAX;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var21;
  ostream *poVar22;
  ostream *poVar23;
  pointer ppSVar24;
  size_t sVar25;
  undefined8 uVar26;
  ShaderProgram *pSVar27;
  undefined8 *puVar28;
  long *plVar29;
  pointer pbVar30;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Varying_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>_>
  _Var31;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var32;
  ObjectWrapper *this_01;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  NotSupportedError *this_02;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin;
  VarTypeComponent *pVVar33;
  vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  *pvVar34;
  char *nameWithPath;
  long lVar35;
  pointer pVVar36;
  pointer pOVar37;
  char *pcVar38;
  ulong uVar39;
  pointer_____offset_0x10___ *ppuVar40;
  undefined1 auVar41 [8];
  anon_struct_8_2_bfd9d0cb_for_basic in_R8;
  int iVar42;
  uint uVar43;
  pointer ppSVar44;
  GLuint GVar45;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cur;
  value_type *__x;
  VectorTypeIterator vecIter;
  VectorTypeIterator vecIter_1;
  string attribName;
  VarType attribType;
  VarType subType;
  string fragSource;
  int numTfVaryings;
  string vertSource;
  Attribute *attrib;
  ostringstream frag;
  ostringstream vtx;
  undefined1 local_4a8 [40];
  pointer local_480;
  undefined1 local_478 [16];
  undefined1 local_468 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  StructType *local_418;
  Data local_410;
  deUint32 local_3fc;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined1 local_3d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b8;
  Functions *local_3b0;
  ulong local_3a8;
  undefined1 local_3a0 [24];
  pointer local_388;
  deUint32 local_37c;
  undefined1 local_378 [17];
  undefined7 uStack_367;
  pointer local_360;
  ProgramSpec *local_358;
  Attribute *local_350;
  undefined1 local_348 [8];
  undefined1 auStack_340 [8];
  undefined1 local_338 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_330 [2];
  ios_base local_2d8 [272];
  undefined1 local_1c8 [8];
  pointer pbStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  VarType local_1a8 [3];
  ios_base local_158 [8];
  ios_base local_150 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_138;
  deUint32 local_120;
  undefined1 local_118 [208];
  RenderContext *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_3b0 = (Functions *)CONCAT44(extraout_var,iVar19);
  local_48 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_37c = this->m_bufferMode;
  dVar4 = this->m_primitiveType;
  local_378._0_8_ = local_378 + 0x10;
  local_378._8_8_ = (pointer)0x0;
  local_378[0x10] = 0;
  local_3d8._0_8_ = local_3d8 + 0x10;
  local_3d8._8_8_ = (VarTypeComponent *)0x0;
  local_3d8._16_8_ = local_3d8._16_8_ & 0xffffffffffffff00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  _Var21 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[13]>>
                     ((this->m_progSpec).m_transformFeedbackVaryings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->m_progSpec).m_transformFeedbackVaryings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,"gl_PointSize");
  pbVar6 = (this->m_progSpec).m_transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"uniform highp vec4 u_scale;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"uniform highp vec4 u_bias;\n",0x1b);
  if (_Var21._M_current != pbVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"in highp float a_pointSize;\n",0x1c);
  }
  pVVar36 = (this->m_progSpec).m_varyings.
            super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3fc = dVar4;
  local_40 = pbVar6;
  local_38 = _Var21._M_current;
  if (pVVar36 !=
      (this->m_progSpec).m_varyings.
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_480 = (pointer)(pVVar36->name)._M_dataplus._M_p;
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_4a8,&pVVar36->type);
      while( true ) {
        local_468._0_8_ = (VarTypeComponent *)0x0;
        local_468._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_478._0_8_ = (StructType *)0x0;
        local_478._8_4_ = TYPE_INVALID;
        local_478._12_4_ = PRECISION_LOWP;
        bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                           ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_4a8,
                            (SubTypeIterator<glu::IsVectorOrScalarType> *)local_478);
        if ((anon_struct_8_2_bfd9d0cb_for_basic)local_478._8_8_ !=
            (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
          operator_delete((void *)local_478._8_8_,local_468._8_8_ - local_478._8_8_);
        }
        if (!bVar18) break;
        pVVar33 = (VarTypeComponent *)local_4a8._16_8_;
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  ((VarType *)&local_418,(glu *)&pVVar36->type,(VarType *)local_4a8._8_8_,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )local_4a8._16_8_,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )in_R8);
        getAttributeName_abi_cxx11_
                  ((string *)local_438,(TransformFeedback *)local_480,local_4a8 + 8,
                   (TypeComponentVector *)pVVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"in ",3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3f8,(char *)local_438._0_8_,(allocator<char> *)&local_350);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_478,(VarType *)&local_418,(string *)local_3f8,0);
        poVar22 = glu::decl::operator<<((ostream *)local_1c8,(DeclareVariable *)local_478);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._8_8_ != &local_450) {
          operator_delete((void *)local_468._8_8_,local_450._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_478);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._0_8_ != &local_3e8) {
          operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ != &local_428) {
          operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)&local_418);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                  ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_3a0,
                   (SubTypeIterator<glu::IsVectorOrScalarType> *)local_4a8,0);
        if ((pointer)local_3a0._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_3a0._8_8_,(long)local_388 - local_3a0._8_8_);
        }
      }
      if ((VarType *)local_4a8._8_8_ != (VarType *)0x0) {
        operator_delete((void *)local_4a8._8_8_,local_4a8._24_8_ - local_4a8._8_8_);
      }
      pVVar36 = pVVar36 + 1;
    } while (pVVar36 !=
             (this->m_progSpec).m_varyings.
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_358 = &this->m_progSpec;
  uVar26 = CONCAT71((int7)((ulong)local_358 >> 8),1);
  do {
    local_3a8 = CONCAT44(local_3a8._4_4_,(int)uVar26);
    bVar18 = (char)uVar26 != '\0';
    local_480 = (pointer)0x1c3b6d3;
    if (bVar18) {
      local_480 = (pointer)0x1c1a48e;
    }
    poVar22 = (ostream *)local_348;
    if (bVar18) {
      poVar22 = (ostream *)local_1c8;
    }
    ppSVar44 = (this->m_progSpec).m_structs.
               super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppSVar24 = (this->m_progSpec).m_structs.
               super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppSVar44 != ppSVar24) {
      do {
        if (((*ppSVar44)->m_typeName)._M_string_length != 0) {
          local_478._8_8_ = local_478._8_8_ & 0xffffffff00000000;
          local_478._0_8_ = *ppSVar44;
          poVar23 = glu::decl::operator<<(poVar22,(DeclareStructTypePtr *)local_478);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,";\n",2);
          ppSVar24 = (this->m_progSpec).m_structs.
                     super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        }
        ppSVar44 = ppSVar44 + 1;
      } while (ppSVar44 != ppSVar24);
      pVVar36 = (this->m_progSpec).m_varyings.
                super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    pVVar7 = (this->m_progSpec).m_varyings.
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pVVar7 != pVVar36) {
      uVar43 = (uint)(byte)local_3a8;
      pVVar36 = pVVar7;
      do {
        if ((ulong)pVVar36->interpolation < 3) {
          pcVar38 = *(char **)(&DAT_021365a0 + (ulong)pVVar36->interpolation * 8);
          sVar25 = strlen(pcVar38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,pcVar38,sVar25);
        }
        else {
          std::ios::clear((int)poVar22->_vptr_basic_ostream[-3] + (int)poVar22);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,(char *)local_480,(ulong)(uVar43 & 1) | 2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4a8,(pVVar36->name)._M_dataplus._M_p,(allocator<char> *)local_438
                  );
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_478,&pVVar36->type,(string *)local_4a8,0);
        poVar23 = glu::decl::operator<<(poVar22,(DeclareVariable *)local_478);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._8_8_ != &local_450) {
          operator_delete((void *)local_468._8_8_,local_450._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_478);
        if ((VarType *)local_4a8._0_8_ != (VarType *)(local_4a8 + 0x10)) {
          operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
        }
        pVVar36 = pVVar36 + 1;
      } while (pVVar36 !=
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    uVar26 = 0;
  } while ((local_3a8 & 1) != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"\nvoid main (void)\n{\n",0x14);
  pbVar17 = local_38;
  pbVar6 = local_40;
  dVar4 = local_3fc;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"\thighp vec4 res = vec4(0.0);\n",0x1d);
  if (dVar4 == 0 || pbVar17 != pbVar6) {
    pcVar38 = "\tgl_PointSize = 1.0;\n";
    if (pbVar17 != pbVar6) {
      pcVar38 = "\tgl_PointSize = a_pointSize;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,pcVar38,(ulong)(pbVar17 != pbVar6) * 8 + 0x15);
  }
  pVVar36 = (this->m_progSpec).m_varyings.
            super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar36 !=
      (this->m_progSpec).m_varyings.
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    varyingName = (anon_struct_8_2_bfd9d0cb_for_basic)((long)local_478 + 8);
    do {
      this_00 = (TransformFeedback *)(pVVar36->name)._M_dataplus._M_p;
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_478,&pVVar36->type);
      local_480 = pVVar36;
      while( true ) {
        local_4a8._16_8_ = (VarTypeComponent *)0x0;
        local_4a8._24_8_ = (pointer)0x0;
        local_4a8._0_8_ = (VarType *)0x0;
        local_4a8._8_8_ = (VarType *)0x0;
        bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                           ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_478,
                            (SubTypeIterator<glu::IsVectorOrScalarType> *)local_4a8);
        if ((VarType *)local_4a8._8_8_ != (VarType *)0x0) {
          operator_delete((void *)local_4a8._8_8_,local_4a8._24_8_ - local_4a8._8_8_);
        }
        pVVar7 = local_480;
        if (!bVar18) break;
        pVVar33 = (VarTypeComponent *)local_468._0_8_;
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  ((VarType *)local_3f8,(glu *)&pVVar36->type,(VarType *)local_478._8_8_,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )local_468._0_8_,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )in_R8);
        getAttributeName_abi_cxx11_
                  ((string *)local_4a8,this_00,(char *)varyingName,(TypeComponentVector *)pVVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\t",1);
        if (this_00 == (TransformFeedback *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffffb48 +
                          (int)*(_func_int **)((long)local_1c8 + -0x18) + 0x2f0);
        }
        else {
          sVar25 = strlen((char *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,(char *)this_00,sVar25);
        }
        local_418 = (StructType *)local_478._0_8_;
        local_410._0_8_ = varyingName;
        glu::operator<<((ostream *)local_1c8,(TypeAccessFormat *)&local_418);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," = ",3);
        poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c8,(char *)local_4a8._0_8_,local_4a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,";\n",2);
        iVar19 = glu::getDataTypeScalarSize(local_3f8._8_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"\tres += ",8);
        switch(iVar19) {
        case 1:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"vec4(",5);
          if (this_00 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffb48 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_348 + -0x20))->_M_string_length + 0x170);
          }
          else {
            sVar25 = strlen((char *)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_348,(char *)this_00,sVar25);
          }
          local_418 = (StructType *)local_478._0_8_;
          local_410._0_8_ = varyingName;
          glu::operator<<((ostream *)local_348,(TypeAccessFormat *)&local_418);
          goto LAB_0115ba1c;
        case 2:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"vec2(",5);
          if (this_00 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffb48 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_348 + -0x20))->_M_string_length + 0x170);
          }
          else {
            sVar25 = strlen((char *)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_348,(char *)this_00,sVar25);
          }
          local_418 = (StructType *)local_478._0_8_;
          local_410._0_8_ = varyingName;
          glu::operator<<((ostream *)local_348,(TypeAccessFormat *)&local_418);
          lVar35 = 6;
          pcVar38 = ").xxyy";
          break;
        case 3:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"vec3(",5);
          if (this_00 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffb48 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_348 + -0x20))->_M_string_length + 0x170);
          }
          else {
            sVar25 = strlen((char *)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_348,(char *)this_00,sVar25);
          }
          local_418 = (StructType *)local_478._0_8_;
          local_410._0_8_ = varyingName;
          glu::operator<<((ostream *)local_348,(TypeAccessFormat *)&local_418);
          lVar35 = 6;
          pcVar38 = ").xyzx";
          break;
        case 4:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"vec4(",5);
          if (this_00 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffb48 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_348 + -0x20))->_M_string_length + 0x170);
          }
          else {
            sVar25 = strlen((char *)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_348,(char *)this_00,sVar25);
          }
          local_418 = (StructType *)local_478._0_8_;
          local_410._0_8_ = varyingName;
          glu::operator<<((ostream *)local_348,(TypeAccessFormat *)&local_418);
LAB_0115ba1c:
          lVar35 = 1;
          pcVar38 = ")";
          break;
        default:
          goto switchD_0115b852_default;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar38,lVar35);
switchD_0115b852_default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,";\n",2);
        if ((VarType *)local_4a8._0_8_ != (VarType *)(local_4a8 + 0x10)) {
          operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
        }
        glu::VarType::~VarType((VarType *)local_3f8);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                  ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_438,
                   (SubTypeIterator<glu::IsVectorOrScalarType> *)local_478,0);
        pvVar15 = (void *)CONCAT44(local_438._12_4_,local_438._8_4_);
        if (pvVar15 != (void *)0x0) {
          operator_delete(pvVar15,local_428._8_8_ - (long)pvVar15);
        }
      }
      if ((anon_struct_8_2_bfd9d0cb_for_basic)local_478._8_8_ !=
          (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
        operator_delete((void *)local_478._8_8_,local_468._8_8_ - local_478._8_8_);
      }
      pVVar36 = pVVar7 + 1;
    } while (pVVar36 !=
             (this->m_progSpec).m_varyings.
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"\to_color = res * u_scale + u_bias;\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_378,(string *)local_478);
  if ((StructType *)local_478._0_8_ != (StructType *)local_468) {
    operator_delete((void *)local_478._0_8_,(ulong)(local_468._0_8_ + 1));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_3d8,(string *)local_478);
  if ((StructType *)local_478._0_8_ != (StructType *)local_468) {
    operator_delete((void *)local_478._0_8_,(ulong)(local_468._0_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pSVar27 = (ShaderProgram *)operator_new(0xd0);
  memset(local_1c8,0,0xac);
  local_118._0_8_ = (pointer)0x0;
  local_118[8] = 0;
  local_118._9_7_ = 0;
  local_118[0x10] = 0;
  local_118._17_8_ = 0;
  local_348 = (undefined1  [8])((ulong)(uint)local_348._4_4_ << 0x20);
  auStack_340 = (undefined1  [8])abStack_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_340,local_378._0_8_,
             (undefined1 *)((long)(Type *)local_378._8_8_ + local_378._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + ((ulong)local_348 & 0xffffffff) * 0x18),(value_type *)auStack_340);
  local_478._0_4_ = 1;
  local_478._8_8_ = (VarType *)(local_468 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_478 + 8),local_3d8._0_8_,
             (undefined1 *)((long)(Type *)local_3d8._8_8_ + local_3d8._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + (local_478._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_478 + 8));
  pvVar8 = (this->m_progSpec).m_transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->m_progSpec).m_transformFeedbackVaryings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; pvVar8 != __x; __x = __x + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118,__x);
  }
  local_120 = local_37c;
  glu::ShaderProgram::ShaderProgram(pSVar27,local_48,(ProgramSources *)local_1c8);
  if ((VarType *)local_478._8_8_ != (VarType *)(local_468 + 8)) {
    operator_delete((void *)local_478._8_8_,(ulong)(local_468._8_8_ + 1));
  }
  if (auStack_340 != (undefined1  [8])abStack_330) {
    operator_delete((void *)auStack_340,
                    CONCAT44(abStack_330[0]._M_dataplus._M_p._4_4_,
                             CONCAT13(abStack_330[0]._M_dataplus._M_p._3_1_,
                                      CONCAT12(abStack_330[0]._M_dataplus._M_p._2_1_,
                                               abStack_330[0]._M_dataplus._M_p._0_2_))) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_138);
  lVar35 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + lVar35));
    lVar35 = lVar35 + -0x18;
  } while (lVar35 != -0x18);
  if ((VarType *)local_3d8._0_8_ != (VarType *)(local_3d8 + 0x10)) {
    operator_delete((void *)local_3d8._0_8_,(ulong)((long)(Type *)local_3d8._16_8_ + 1));
  }
  paVar1 = local_3b8;
  if ((VarType *)local_378._0_8_ != (VarType *)(local_378 + 0x10)) {
    operator_delete((void *)local_378._0_8_,CONCAT71(uStack_367,local_378[0x10]) + 1);
  }
  this->m_program = pSVar27;
  glu::operator<<((TestLog *)&paVar1->_M_allocated_capacity,pSVar27);
  pSVar27 = this->m_program;
  if ((pSVar27->m_program).m_info.linkOk != false) {
    local_1c8 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_1c0,"Transform feedback varyings: ",0x1d);
    local_348 = (undefined1  [8])
                (this->m_progSpec).m_transformFeedbackVaryings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    auStack_340 = (undefined1  [8])
                  (this->m_progSpec).m_transformFeedbackVaryings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    tcu::Format::operator<<
              ((ostream *)&pbStack_1c0,
               (Array<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_348);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1c0);
    std::ios_base::~ios_base(local_150);
    local_1c8 = (undefined1  [8])local_3b8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_1c0,"Transform feedback varyings reported by compiler:",0x31);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1c0);
    std::ios_base::~ios_base(local_150);
    pFVar16 = local_3b0;
    GVar5 = (this->m_program->m_program).m_program;
    local_3a0._0_8_ = (ulong)(uint)local_3a0._4_4_ << 0x20;
    local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
    (*local_3b0->getProgramiv)(GVar5,0x8c83,(GLint *)local_3a0);
    (*pFVar16->getProgramiv)(GVar5,0x8c76,(GLint *)local_378);
    GVar20 = (*pFVar16->getError)();
    glu::checkError(GVar20,"Query TF varyings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x338);
    local_1c8 = (undefined1  [8])local_3b8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_1c0,"GL_TRANSFORM_FEEDBACK_VARYINGS = ",0x21);
    std::ostream::operator<<((ostringstream *)&pbStack_1c0,local_3a0._0_4_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1c0);
    std::ios_base::~ios_base(local_150);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_438,(long)(local_378._0_4_ + 1),
               (allocator_type *)local_1c8);
    if (0 < (int)local_3a0._0_4_) {
      GVar45 = 0;
      do {
        local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffff00000000;
        local_418 = (StructType *)((ulong)local_418 & 0xffffffff00000000);
        in_R8 = (anon_struct_8_2_bfd9d0cb_for_basic)local_3d8;
        (*local_3b0->getTransformFeedbackVarying)
                  (GVar5,GVar45,local_438._8_4_ - (int)local_438._0_8_,(GLsizei *)0x0,
                   (GLsizei *)in_R8,(GLenum *)&local_418,(GLchar *)local_438._0_8_);
        GVar20 = (*local_3b0->getError)();
        glu::checkError(GVar20,"glGetTransformFeedbackVarying()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                        ,0x344);
        dataType = glu::getDataTypeFromGLType((Type)local_418);
        if (dataType == TYPE_LAST) {
          local_468._0_8_ = (VarTypeComponent *)0x286e776f6e6b6e75;
          local_478._8_4_ = TYPE_FLOAT_MAT3X2;
          local_478._12_4_ = PRECISION_LOWP;
          local_468._8_8_ = local_468._8_8_ & 0xffffffffffffff00;
          local_3f8._0_8_ = (ulong)local_418 & 0xffffffff;
          local_478._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_468;
          tcu::Format::Hex<8ul>::toString_abi_cxx11_((string *)local_4a8,local_3f8);
          pVVar33 = (VarTypeComponent *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468) {
            pVVar33 = (VarTypeComponent *)local_468._0_8_;
          }
          pVVar3 = (VarTypeComponent *)((long)(Type *)local_4a8._8_8_ + local_478._8_8_);
          in_R8 = (anon_struct_8_2_bfd9d0cb_for_basic)local_478._8_8_;
          if (pVVar33 < pVVar3) {
            pVVar33 = (VarTypeComponent *)0xf;
            if ((VarType *)local_4a8._0_8_ != (VarType *)(local_4a8 + 0x10)) {
              pVVar33 = (VarTypeComponent *)local_4a8._16_8_;
            }
            if (pVVar33 < pVVar3) goto LAB_0115c15a;
            puVar28 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_4a8,0,(char *)0x0,local_478._0_8_);
          }
          else {
LAB_0115c15a:
            puVar28 = (undefined8 *)std::__cxx11::string::_M_append(local_478,local_4a8._0_8_);
          }
          local_1c8 = (undefined1  [8])&local_1b8;
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar28 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar28 == paVar1) {
            local_1b8._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_1b8._8_8_ = puVar28[3];
          }
          else {
            local_1b8._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_1c8 = (undefined1  [8])*puVar28;
          }
          pbStack_1c0 = (pointer)puVar28[1];
          *puVar28 = paVar1;
          puVar28[1] = 0;
          paVar1->_M_local_buf[0] = '\0';
          plVar29 = (long *)std::__cxx11::string::append((char *)local_1c8);
          local_348 = (undefined1  [8])local_338;
          pbVar30 = (pointer)(plVar29 + 2);
          if ((pointer)*plVar29 == pbVar30) {
            pcVar9 = (pbVar30->_M_dataplus)._M_p;
            lVar35 = plVar29[3];
            local_338._0_7_ = SUB87(pcVar9,0);
            local_338[7] = (undefined1)((ulong)pcVar9 >> 0x38);
            abStack_330[0]._M_dataplus._M_p._0_2_ = (undefined2)lVar35;
            abStack_330[0]._M_dataplus._M_p._2_1_ = (undefined1)((ulong)lVar35 >> 0x10);
            abStack_330[0]._M_dataplus._M_p._3_1_ = (undefined1)((ulong)lVar35 >> 0x18);
            abStack_330[0]._M_dataplus._M_p._4_4_ = (undefined4)((ulong)lVar35 >> 0x20);
          }
          else {
            pcVar9 = (pbVar30->_M_dataplus)._M_p;
            local_338._0_7_ = SUB87(pcVar9,0);
            local_338[7] = (undefined1)((ulong)pcVar9 >> 0x38);
            local_348 = (undefined1  [8])*plVar29;
          }
          auStack_340 = (undefined1  [8])plVar29[1];
          *plVar29 = (long)pbVar30;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          if (local_1c8 != (undefined1  [8])&local_1b8) {
            operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
          if ((VarType *)local_4a8._0_8_ != (VarType *)(local_4a8 + 0x10)) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468) {
            operator_delete((void *)local_478._0_8_,(ulong)(local_468._0_8_ + 1));
          }
        }
        else {
          pcVar38 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_348,pcVar38,(allocator<char> *)local_1c8);
        }
        local_1c8 = (undefined1  [8])local_3b8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1c0);
        uVar26 = local_438._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)(ostringstream *)&pbStack_1c0 + (int)pbStack_1c0[-1]._M_string_length
                         );
        }
        else {
          sVar25 = strlen((char *)local_438._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pbStack_1c0,(char *)uVar26,sVar25);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_1c0,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pbStack_1c0,(char *)local_348,(long)auStack_340);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_1c0,"[",1);
        std::ostream::operator<<((ostringstream *)&pbStack_1c0,local_3d8._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_1c0,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1c0);
        std::ios_base::~ios_base(local_150);
        if (local_348 != (undefined1  [8])local_338) {
          operator_delete((void *)local_348,CONCAT17(local_338[7],local_338._0_7_) + 1);
        }
        GVar45 = GVar45 + 1;
      } while ((int)GVar45 < (int)local_3a0._0_4_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity - local_438._0_8_);
    }
    _Var21 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[13]>>
                       ((this->m_progSpec).m_transformFeedbackVaryings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->m_progSpec).m_transformFeedbackVaryings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"gl_PointSize");
    pbVar6 = (this->m_progSpec).m_transformFeedbackVaryings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this->m_inputStride = 0;
    local_338._0_7_ = 0x7469736f705f61;
    local_338[7] = 'i';
    abStack_330[0]._M_dataplus._M_p._0_2_ = 0x6e6f;
    auStack_340 = (undefined1  [8])0xa;
    abStack_330[0]._M_dataplus._M_p._2_1_ = '\0';
    local_348 = (undefined1  [8])local_338;
    glu::VarType::VarType((VarType *)local_478,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    Attribute::Attribute
              ((Attribute *)local_1c8,(string *)local_348,(VarType *)local_478,this->m_inputStride);
    local_480 = (pointer)&this->m_attributes;
    std::
    vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
    ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
              ((vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                *)local_480,(Attribute *)local_1c8);
    glu::VarType::~VarType(local_1a8);
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    glu::VarType::~VarType((VarType *)local_478);
    if (local_348 != (undefined1  [8])local_338) {
      operator_delete((void *)local_348,CONCAT17(local_338[7],local_338._0_7_) + 1);
    }
    this->m_inputStride = this->m_inputStride + 0x10;
    if (_Var21._M_current != pbVar6) {
      local_338._0_7_ = 0x746e696f705f61;
      local_338[7] = 'S';
      abStack_330[0]._M_dataplus._M_p._0_2_ = 0x7a69;
      abStack_330[0]._M_dataplus._M_p._2_1_ = 'e';
      auStack_340 = (undefined1  [8])0xb;
      abStack_330[0]._M_dataplus._M_p._3_1_ = '\0';
      local_348 = (undefined1  [8])local_338;
      glu::VarType::VarType((VarType *)local_478,TYPE_FLOAT,PRECISION_HIGHP);
      Attribute::Attribute
                ((Attribute *)local_1c8,(string *)local_348,(VarType *)local_478,this->m_inputStride
                );
      std::
      vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
                ((vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                  *)local_480,(Attribute *)local_1c8);
      glu::VarType::~VarType(local_1a8);
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      glu::VarType::~VarType((VarType *)local_478);
      if (local_348 != (undefined1  [8])local_338) {
        operator_delete((void *)local_348,CONCAT17(local_338[7],local_338._0_7_) + 1);
      }
      this->m_inputStride = this->m_inputStride + 4;
    }
    pVVar36 = (this->m_progSpec).m_varyings.
              super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pVVar36 !=
        (this->m_progSpec).m_varyings.
        super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                  ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_348,&pVVar36->type);
        while( true ) {
          local_1b8._M_allocated_capacity = 0;
          local_1b8._8_8_ = (pointer)0x0;
          local_1c8 = (undefined1  [8])0x0;
          pbStack_1c0 = (pointer)0x0;
          bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                             ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_348,
                              (SubTypeIterator<glu::IsVectorOrScalarType> *)local_1c8);
          if (pbStack_1c0 != (pointer)0x0) {
            operator_delete(pbStack_1c0,local_1b8._8_8_ - (long)pbStack_1c0);
          }
          if (!bVar18) break;
          begin._M_current._7_1_ = local_338[7];
          begin._M_current._0_7_ = local_338._0_7_;
          glu::
          getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                    ((VarType *)local_438,(glu *)local_348,(VarType *)auStack_340,begin,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )in_R8);
          getAttributeName_abi_cxx11_
                    ((string *)local_478,(TransformFeedback *)(pVVar36->name)._M_dataplus._M_p,
                     auStack_340,(TypeComponentVector *)begin._M_current);
          Attribute::Attribute
                    ((Attribute *)local_1c8,(string *)local_478,(VarType *)local_438,
                     this->m_inputStride);
          std::
          vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
          ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
                    ((vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                      *)local_480,(Attribute *)local_1c8);
          glu::VarType::~VarType(local_1a8);
          if (local_1c8 != (undefined1  [8])&local_1b8) {
            operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
          iVar19 = glu::getDataTypeScalarSize(local_438._8_4_);
          this->m_inputStride = this->m_inputStride + iVar19 * 4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468) {
            operator_delete((void *)local_478._0_8_,(ulong)(local_468._0_8_ + 1));
          }
          glu::VarType::~VarType((VarType *)local_438);
          glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                    ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_4a8,
                     (SubTypeIterator<glu::IsVectorOrScalarType> *)local_348,0);
          if ((VarType *)local_4a8._8_8_ != (VarType *)0x0) {
            operator_delete((void *)local_4a8._8_8_,local_4a8._24_8_ - local_4a8._8_8_);
          }
        }
        if (auStack_340 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_340,
                          CONCAT44(abStack_330[0]._M_dataplus._M_p._4_4_,
                                   CONCAT13(abStack_330[0]._M_dataplus._M_p._3_1_,
                                            CONCAT12(abStack_330[0]._M_dataplus._M_p._2_1_,
                                                     abStack_330[0]._M_dataplus._M_p._0_2_))) -
                          (long)auStack_340);
        }
        pVVar36 = pVVar36 + 1;
      } while (pVVar36 !=
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&this->m_transformFeedbackOutputs;
    local_3fc = this->m_bufferMode;
    std::
    vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
    ::resize((vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
              *)local_3b8,
             (long)(this->m_progSpec).m_transformFeedbackVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_progSpec).m_transformFeedbackVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
    pbVar30 = (this->m_progSpec).m_transformFeedbackVaryings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_progSpec).m_transformFeedbackVaryings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar30) >> 5)) {
      pvVar34 = (vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 *)0x0;
      uVar39 = 0;
      do {
        pbVar30 = pbVar30 + (long)pvVar34;
        iVar19 = 0;
        if (local_3fc == 0x8c8d) {
          iVar19 = (int)pvVar34;
        }
        iVar42 = (int)uVar39;
        if (local_3fc == 0x8c8d) {
          iVar42 = 0;
        }
        pOVar10 = (((_Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                     *)local_3b8)->_M_impl).super__Vector_impl_data._M_start;
        pOVar37 = pOVar10 + (long)pvVar34;
        local_480 = (pointer)pvVar34;
        local_3a8 = uVar39;
        std::__cxx11::string::_M_assign((string *)pOVar37);
        pOVar10[(long)pvVar34].bufferNdx = iVar19;
        pOVar10[(long)pvVar34].offset = iVar42;
        iVar19 = std::__cxx11::string::compare((char *)pbVar30);
        if (iVar19 == 0) {
          _Var32._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Var11._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_348 = (undefined1  [8])local_338;
          local_338._0_7_ = 0x7469736f705f61;
          local_338[7] = 'i';
          abStack_330[0]._M_dataplus._M_p._0_2_ = 0x6e6f;
          auStack_340 = (undefined1  [8])0xa;
          abStack_330[0]._M_dataplus._M_p._2_1_ = '\0';
          local_1c8 = (undefined1  [8])&local_1b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c8,local_348,
                     (undefined1 *)((long)&abStack_330[0]._M_dataplus._M_p + 2));
          _Var32 = std::
                   find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                             (_Var32,_Var11,(AttributeNameEquals *)local_1c8);
          uVar26 = local_1b8._M_allocated_capacity;
          auVar41 = local_1c8;
          if (local_1c8 != (undefined1  [8])&local_1b8) {
LAB_0115cd39:
            operator_delete((void *)auVar41,
                            (ulong)((long)&(((pointer)uVar26)->_M_dataplus)._M_p + 1));
          }
LAB_0115cd41:
          if (local_348 != (undefined1  [8])local_338) {
            operator_delete((void *)local_348,CONCAT17(local_338[7],local_338._0_7_) + 1);
          }
          local_438._0_8_ = _Var32._M_current;
          glu::VarType::operator=(&pOVar37->type,(VarType *)((long)_Var32._M_current + 0x20));
          iVar12._M_current =
               *(Attribute ***)
                &(pOVar37->inputs).
                 super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              *(Attribute ***)
               &(pOVar37->inputs).
                super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
            ::_M_realloc_insert<deqp::gles3::Functional::TransformFeedback::Attribute_const*const&>
                      ((vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
                        *)&pOVar37->inputs,iVar12,(Attribute **)local_438);
          }
          else {
            *iVar12._M_current = (Attribute *)local_438._0_8_;
            psVar2 = (string *)
                     &(pOVar37->inputs).
                      super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            *(long *)psVar2 = *(long *)psVar2 + 8;
          }
        }
        else {
          iVar19 = std::__cxx11::string::compare((char *)pbVar30);
          if (iVar19 == 0) {
            _Var32._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var11._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_338._0_7_ = 0x746e696f705f61;
            local_338[7] = 'S';
            abStack_330[0]._M_dataplus._M_p._0_2_ = 0x7a69;
            abStack_330[0]._M_dataplus._M_p._2_1_ = 'e';
            auStack_340 = (undefined1  [8])0xb;
            abStack_330[0]._M_dataplus._M_p._3_1_ = '\0';
            local_478._0_8_ = local_468;
            local_348 = (undefined1  [8])local_338;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_478,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,(undefined1 *)((long)&abStack_330[0]._M_dataplus._M_p + 3));
            _Var32 = std::
                     find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                               (_Var32,_Var11,(AttributeNameEquals *)local_478);
            uVar26 = local_468._0_8_;
            auVar41 = (undefined1  [8])local_478._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468) goto LAB_0115cd39;
            goto LAB_0115cd41;
          }
          glu::parseVariableName_abi_cxx11_
                    ((string *)local_348,(glu *)(pbVar30->_M_dataplus)._M_p,nameWithPath);
          _Var31._M_current =
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_start;
          __last._M_current =
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_4a8._0_8_ = local_4a8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4a8,local_348,
                     (glu *)((long)&((_Alloc_hider *)auStack_340)->_M_p + (long)local_348));
          _Var31 = std::
                   find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Varying_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Varying,std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>>>,deqp::gles3::Functional::TransformFeedback::VaryingNameEquals>
                             (_Var31,__last,(VaryingNameEquals *)local_4a8);
          if ((VarType *)local_4a8._0_8_ != (VarType *)(local_4a8 + 0x10)) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
          }
          local_3d8._0_8_ = (VarType *)0x0;
          local_3d8._8_8_ = (VarTypeComponent *)0x0;
          local_3d8._16_8_ = (pointer)0x0;
          glu::parseTypePath((pbVar30->_M_dataplus)._M_p,&(_Var31._M_current)->type,
                             (TypeComponentVector *)local_3d8);
          pVVar33 = (VarTypeComponent *)local_3d8._8_8_;
          glu::
          getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                    ((VarType *)local_438,(glu *)&(_Var31._M_current)->type,
                     (VarType *)local_3d8._0_8_,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )local_3d8._8_8_,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )in_R8);
          glu::VarType::operator=(&pOVar37->type,(VarType *)local_438);
          glu::VarType::~VarType((VarType *)local_438);
          glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                    ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_438,&pOVar37->type);
          while( true ) {
            local_3e8._M_allocated_capacity = 0;
            local_3e8._8_8_ = 0;
            local_3f8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3f8._8_4_ = TYPE_INVALID;
            local_3f8._12_4_ = PRECISION_LOWP;
            bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                               ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_438,
                                (SubTypeIterator<glu::IsVectorOrScalarType> *)local_3f8);
            if ((anon_struct_8_2_bfd9d0cb_for_basic)local_3f8._8_8_ !=
                (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
              operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ - local_3f8._8_8_);
            }
            if (!bVar18) break;
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::vector
                      ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                       &local_418,
                       ((long)(local_428._M_allocated_capacity -
                              CONCAT44(local_438._12_4_,local_438._8_4_)) >> 3) +
                       ((long)(local_3d8._8_8_ - local_3d8._0_8_) >> 3),(allocator_type *)local_3f8)
            ;
            if (local_3d8._8_8_ - local_3d8._0_8_ != 0) {
              memmove(local_418,(void *)local_3d8._0_8_,local_3d8._8_8_ - local_3d8._0_8_);
            }
            sVar25 = local_428._M_allocated_capacity -
                     (long)CONCAT44(local_438._12_4_,local_438._8_4_);
            if (sVar25 != 0) {
              memmove((void *)(local_3d8._8_8_ + ((long)local_418 - local_3d8._0_8_)),
                      (void *)CONCAT44(local_438._12_4_,local_438._8_4_),sVar25);
            }
            getAttributeName_abi_cxx11_
                      ((string *)local_3f8,(TransformFeedback *)local_348,(char *)&local_418,
                       (TypeComponentVector *)pVVar33);
            _Var32._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var11._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_3a0._0_8_ = local_3a0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3a0,local_3f8._0_8_,
                       (pointer)((long)(Type *)local_3f8._8_8_ + local_3f8._0_8_));
            _Var32 = std::
                     find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                               (_Var32,_Var11,(AttributeNameEquals *)local_3a0);
            if ((VarType *)local_3a0._0_8_ != (VarType *)(local_3a0 + 0x10)) {
              operator_delete((void *)local_3a0._0_8_,(ulong)((long)(Type *)local_3a0._16_8_ + 1));
            }
            iVar12._M_current =
                 *(Attribute ***)
                  &(pOVar37->inputs).
                   super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            local_350 = _Var32._M_current;
            if (iVar12._M_current ==
                *(Attribute ***)
                 &(pOVar37->inputs).
                  super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
              ::
              _M_realloc_insert<deqp::gles3::Functional::TransformFeedback::Attribute_const*const&>
                        ((vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
                          *)&pOVar37->inputs,iVar12,&local_350);
            }
            else {
              *iVar12._M_current = _Var32._M_current;
              psVar2 = (string *)
                       &(pOVar37->inputs).
                        super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              *(long *)psVar2 = *(long *)psVar2 + 8;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._0_8_ != &local_3e8) {
              operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
            }
            if (local_418 != (StructType *)0x0) {
              operator_delete(local_418,local_410._8_8_ - (long)local_418);
            }
            glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                      ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_378,
                       (SubTypeIterator<glu::IsVectorOrScalarType> *)local_438,0);
            if ((pointer)local_378._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_378._8_8_,(long)local_360 - local_378._8_8_);
            }
          }
          pvVar15 = (void *)CONCAT44(local_438._12_4_,local_438._8_4_);
          if (pvVar15 != (void *)0x0) {
            operator_delete(pvVar15,local_428._8_8_ - (long)pvVar15);
          }
          if ((VarType *)local_3d8._0_8_ != (VarType *)0x0) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ - local_3d8._0_8_);
          }
          if (local_348 != (undefined1  [8])local_338) {
            operator_delete((void *)local_348,CONCAT17(local_338[7],local_338._0_7_) + 1);
          }
        }
        iVar19 = glu::VarType::getScalarSize(&pOVar37->type);
        uVar39 = (ulong)(uint)((int)local_3a8 + iVar19 * 4);
        pvVar34 = (vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                   *)((long)&(((_Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                                *)&local_480->name)->_M_impl).super__Vector_impl_data._M_start + 1);
        pbVar30 = (this->m_progSpec).m_transformFeedbackVaryings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)pvVar34 <
               (long)(int)((ulong)((long)(this->m_progSpec).m_transformFeedbackVaryings.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar30)
                          >> 5));
    }
    if (this->m_bufferMode == 0x8c8d) {
      pOVar37 = (this->m_transformFeedbackOutputs).
                super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar37 !=
          (this->m_transformFeedbackOutputs).
          super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          iVar19 = glu::VarType::getScalarSize(&pOVar37->type);
          local_1c8._0_4_ = iVar19 << 2;
          iVar13._M_current =
               (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar13._M_current ==
              (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->m_bufferStrides,iVar13,(int *)local_1c8);
          }
          else {
            *iVar13._M_current = iVar19 << 2;
            (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar13._M_current + 1;
          }
          pOVar37 = pOVar37 + 1;
        } while (pOVar37 !=
                 (this->m_transformFeedbackOutputs).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffff00000000);
      pOVar37 = (this->m_transformFeedbackOutputs).
                super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar37 ==
          (this->m_transformFeedbackOutputs).
          super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar19 = 0;
      }
      else {
        do {
          iVar19 = glu::VarType::getScalarSize(&pOVar37->type);
          iVar19 = iVar19 * 4 + local_1c8._0_4_;
          local_1c8._0_4_ = iVar19;
          pOVar37 = pOVar37 + 1;
        } while (pOVar37 !=
                 (this->m_transformFeedbackOutputs).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar13._M_current =
           (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_bufferStrides,iVar13,(int *)local_1c8
                  );
      }
      else {
        *iVar13._M_current = iVar19;
        (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current + 1;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_outputBuffers,
               (long)(this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    pGVar14 = (this->m_outputBuffers).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*local_3b0->genBuffers)
              ((GLsizei)((ulong)((long)(this->m_outputBuffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar14)
                        >> 2),pGVar14);
    this_01 = (ObjectWrapper *)operator_new(0x18);
    iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
    glu::ObjectWrapper::ObjectWrapper(this_01,(Functions *)CONCAT44(extraout_var_00,iVar19),traits);
    this->m_transformFeedback = (TransformFeedback *)this_01;
    GVar20 = (*local_3b0->getError)();
    glu::checkError(GVar20,"init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x3d4);
    this->m_iterNdx = 0;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  if ((((*pSVar27->m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true) &&
     (((*pSVar27->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true)) {
    bVar18 = isProgramSupported(local_3b0,local_358,this->m_bufferMode);
    if (bVar18) {
      bVar18 = hasArraysInTFVaryings(local_358);
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      if (!bVar18) {
        tcu::TestError::TestError
                  ((TestError *)this_02,"Link failed",glcts::fixed_sample_locations_values + 1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                   ,0x3aa);
        goto LAB_0115d081;
      }
      tcu::NotSupportedError::NotSupportedError
                (this_02,"Capturing arrays is not supported (undefined in specification)",
                 glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                 ,0x3a8);
    }
    else {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"Implementation limits execeeded",glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                 ,0x3a6);
    }
    ppuVar40 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_02,"Compile failed",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
               ,0x3ad);
LAB_0115d081:
    ppuVar40 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_02,ppuVar40,tcu::Exception::~Exception);
}

Assistant:

void TransformFeedbackCase::init (void)
{
	TestLog&				log	= m_testCtx.getLog();
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	DE_ASSERT(!m_program);
	m_program = createVertexCaptureProgram(m_context.getRenderContext(), m_progSpec, m_bufferMode, m_primitiveType);

	log << *m_program;
	if (!m_program->isOk())
	{
		const bool linkFail = m_program->getShaderInfo(glu::SHADERTYPE_VERTEX).compileOk &&
							  m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk &&
							  !m_program->getProgramInfo().linkOk;

		if (linkFail)
		{
			if (!isProgramSupported(gl, m_progSpec, m_bufferMode))
				throw tcu::NotSupportedError("Implementation limits execeeded", "", __FILE__, __LINE__);
			else if (hasArraysInTFVaryings(m_progSpec))
				throw tcu::NotSupportedError("Capturing arrays is not supported (undefined in specification)", "", __FILE__, __LINE__);
			else
				throw tcu::TestError("Link failed", "", __FILE__, __LINE__);
		}
		else
			throw tcu::TestError("Compile failed", "", __FILE__, __LINE__);
	}

	log << TestLog::Message << "Transform feedback varyings: " << tcu::formatArray(m_progSpec.getTransformFeedbackVaryings().begin(), m_progSpec.getTransformFeedbackVaryings().end()) << TestLog::EndMessage;

	// Print out transform feedback points reported by GL.
	log << TestLog::Message << "Transform feedback varyings reported by compiler:" << TestLog::EndMessage;
	logTransformFeedbackVaryings(log, gl, m_program->getProgram());

	// Compute input specification.
	computeInputLayout(m_attributes, m_inputStride, m_progSpec.getVaryings(), m_progSpec.isPointSizeUsed());

	// Build list of varyings used in transform feedback.
	computeTransformFeedbackOutputs(m_transformFeedbackOutputs, m_attributes, m_progSpec.getVaryings(), m_progSpec.getTransformFeedbackVaryings(), m_bufferMode);
	DE_ASSERT(!m_transformFeedbackOutputs.empty());

	// Buffer strides.
	DE_ASSERT(m_bufferStrides.empty());
	if (m_bufferMode == GL_SEPARATE_ATTRIBS)
	{
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			m_bufferStrides.push_back(outIter->type.getScalarSize()*(int)sizeof(deUint32));
	}
	else
	{
		int totalSize = 0;
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			totalSize += outIter->type.getScalarSize()*(int)sizeof(deUint32);

		m_bufferStrides.push_back(totalSize);
	}

	// \note Actual storage is allocated in iterate().
	m_outputBuffers.resize(m_bufferStrides.size());
	gl.genBuffers((glw::GLsizei)m_outputBuffers.size(), &m_outputBuffers[0]);

	DE_ASSERT(!m_transformFeedback);
	m_transformFeedback = new glu::TransformFeedback(m_context.getRenderContext());

	GLU_EXPECT_NO_ERROR(gl.getError(), "init");

	m_iterNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}